

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

string * __thiscall
Liby::Timestamp::toString_abi_cxx11_(string *__return_storage_ptr__,Timestamp *this)

{
  long lVar1;
  long *in_FS_OFFSET;
  allocator local_a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  undefined1 local_80 [8];
  tm result;
  char usecString [48];
  Timestamp *this_local;
  
  sprintf((char *)&result.tm_zone," %06ld",(this->tv_).tv_usec);
  if ((this->tv_).tv_sec != *(long *)(*in_FS_OFFSET + -0x40a0)) {
    localtime_r((time_t *)this,(tm *)local_80);
    *(__time_t *)(*in_FS_OFFSET + -0x40a0) = (this->tv_).tv_sec;
    sprintf((char *)(*in_FS_OFFSET + -0x4090),"%4d.%02d.%02d - %02d:%02d:%02d -",
            (ulong)(result.tm_mday + 0x76c),(ulong)(result.tm_hour + 1),(ulong)(uint)result.tm_min,
            (ulong)(uint)result.tm_sec,local_80._4_4_,local_80._0_4_);
  }
  lVar1 = *in_FS_OFFSET;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_a0,(char *)(lVar1 + -0x4090),&local_a1);
  std::operator+(__return_storage_ptr__,&local_a0,(char *)&result.tm_zone);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  return __return_storage_ptr__;
}

Assistant:

std::string Timestamp::toString() const {
    char usecString[48];
#ifndef __linux__
    sprintf(usecString, " %06d", tv_.tv_usec);
#else
    sprintf(usecString, " %06ld", tv_.tv_usec);
#endif
    if (tv_.tv_sec != savedSec) {
        struct tm result;
        ::localtime_r(&(tv_.tv_sec), &result);
        savedSec = tv_.tv_sec;
        sprintf(savedSecString, "%4d.%02d.%02d - %02d:%02d:%02d -",
                result.tm_year + 1900, result.tm_mon + 1, result.tm_mday,
                result.tm_hour, result.tm_min, result.tm_sec);
    }
    return std::string(savedSecString) + usecString;
}